

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLSLMaterialRenderer::setPixelShaderConstant(COpenGLSLMaterialRenderer *this)

{
  int in_ECX;
  f32 *in_RDX;
  s32 in_ESI;
  
  setPixelShaderConstant((COpenGLSLMaterialRenderer *)&this[-1].field_0x68,in_ESI,in_RDX,in_ECX);
  return;
}

Assistant:

bool COpenGLSLMaterialRenderer::setPixelShaderConstant(s32 index, const f32 *floats, int count)
{
	if (index < 0 || UniformInfo[index].location < 0)
		return false;

	bool status = true;

	switch (UniformInfo[index].type) {
	case GL_FLOAT:
		Driver->extGlUniform1fv(UniformInfo[index].location, count, floats);
		break;
	case GL_FLOAT_VEC2:
		Driver->extGlUniform2fv(UniformInfo[index].location, count / 2, floats);
		break;
	case GL_FLOAT_VEC3:
		Driver->extGlUniform3fv(UniformInfo[index].location, count / 3, floats);
		break;
	case GL_FLOAT_VEC4:
		Driver->extGlUniform4fv(UniformInfo[index].location, count / 4, floats);
		break;
	case GL_FLOAT_MAT2:
		Driver->extGlUniformMatrix2fv(UniformInfo[index].location, count / 4, false, floats);
		break;
	case GL_FLOAT_MAT2x3:
		Driver->extGlUniformMatrix2x3fv(UniformInfo[index].location, count / 6, false, floats);
		break;
	case GL_FLOAT_MAT2x4:
		Driver->extGlUniformMatrix2x4fv(UniformInfo[index].location, count / 8, false, floats);
		break;
	case GL_FLOAT_MAT3x2:
		Driver->extGlUniformMatrix3x2fv(UniformInfo[index].location, count / 6, false, floats);
		break;
	case GL_FLOAT_MAT3:
		Driver->extGlUniformMatrix3fv(UniformInfo[index].location, count / 9, false, floats);
		break;
	case GL_FLOAT_MAT3x4:
		Driver->extGlUniformMatrix3x4fv(UniformInfo[index].location, count / 12, false, floats);
		break;
	case GL_FLOAT_MAT4x2:
		Driver->extGlUniformMatrix4x2fv(UniformInfo[index].location, count / 8, false, floats);
		break;
	case GL_FLOAT_MAT4x3:
		Driver->extGlUniformMatrix4x3fv(UniformInfo[index].location, count / 12, false, floats);
		break;
	case GL_FLOAT_MAT4:
		Driver->extGlUniformMatrix4fv(UniformInfo[index].location, count / 16, false, floats);
		break;
	case GL_SAMPLER_1D:
	case GL_SAMPLER_2D:
	case GL_SAMPLER_3D:
	case GL_SAMPLER_CUBE:
	case GL_SAMPLER_1D_SHADOW:
	case GL_SAMPLER_2D_SHADOW: {
		if (floats) {
			const GLint id = static_cast<GLint>(*floats);
			Driver->extGlUniform1iv(UniformInfo[index].location, 1, &id);
		} else
			status = false;
	} break;
	default:
		status = false;
		break;
	}
	return status;
}